

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::IndexPropertyDescriptorMap::IndexPropertyDescriptorMap
          (IndexPropertyDescriptorMap *this,Recycler *recycler,
          IndexPropertyDescriptorMap *indexPropertyDescriptorMap)

{
  uint32 *ptr;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  IndexPropertyDescriptorMap *indexPropertyDescriptorMap_local;
  Recycler *recycler_local;
  IndexPropertyDescriptorMap *this_local;
  
  this->recycler = recycler;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->indexPropertyMap);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierPtr(&this->indexList);
  this->lastIndexAt = indexPropertyDescriptorMap->lastIndexAt;
  ptr = CopyIndexList(indexPropertyDescriptorMap);
  Memory::WriteBarrierPtr<unsigned_int>::operator=(&this->indexList,ptr);
  pBVar1 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&indexPropertyDescriptorMap->indexPropertyMap);
  pBVar1 = JsUtil::
           BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Clone(pBVar1);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->indexPropertyMap,pBVar1);
  return;
}

Assistant:

IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(Recycler* recycler, const IndexPropertyDescriptorMap * const indexPropertyDescriptorMap)
        : recycler(recycler), lastIndexAt(indexPropertyDescriptorMap->lastIndexAt)
    {
        indexList = indexPropertyDescriptorMap->CopyIndexList();
        indexPropertyMap = indexPropertyDescriptorMap->indexPropertyMap->Clone();
    }